

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  App *pAVar4;
  Option *pOVar5;
  allocator local_22d5;
  bool verbose;
  bool disableAutomaticReconnection;
  bool stress;
  bool strict;
  bool compress;
  bool save;
  bool followRedirects;
  bool headersOnly;
  int port;
  int redisPort;
  int jobs;
  int count;
  int delayMs;
  int maxRedirects;
  int transferTimeout;
  int connectTimeOut;
  int statsdPort;
  string hostname;
  string url;
  string channel;
  string pidfile;
  string rolesecret;
  string rolename;
  string endpoint;
  string appkey;
  ofstream f;
  string password;
  string path;
  string data;
  string redisPassword;
  string redisHosts;
  string dsn;
  string message;
  string output;
  string headers;
  string user;
  string local_1e68;
  string local_1e48;
  string local_1e28;
  string local_1e08;
  string local_1de8;
  string local_1dc8;
  string local_1da8;
  string local_1d88;
  string local_1d68;
  string local_1d48;
  string local_1d28;
  string local_1d08;
  string local_1ce8;
  string local_1cc8;
  string local_1ca8;
  string local_1c88;
  string local_1c68;
  string local_1c48;
  string local_1c28;
  string local_1c08;
  string local_1be8;
  string local_1bc8;
  string local_1ba8;
  string local_1b88;
  string local_1b68;
  string local_1b48;
  string local_1b28;
  string local_1b08;
  string local_1ae8;
  string local_1ac8;
  string local_1aa8;
  string local_1a88;
  string local_1a68;
  string local_1a48;
  string local_1a28;
  string local_1a08;
  string local_19e8;
  string local_19c8;
  string local_19a8;
  string local_1988;
  string local_1968;
  string local_1948;
  string local_1928;
  string local_1908;
  string local_18e8;
  string local_18c8;
  string local_18a8;
  string local_1888;
  string local_1868;
  string local_1848;
  string local_1828;
  string local_1808;
  string local_17e8;
  string local_17c8;
  string local_17a8;
  string local_1788;
  string local_1768;
  string local_1748;
  string local_1728;
  string local_1708;
  string local_16e8;
  string local_16c8;
  string local_16a8;
  string local_1688;
  string local_1668;
  string local_1648;
  string local_1628;
  string local_1608;
  string local_15e8;
  string local_15c8;
  string local_15a8;
  string local_1588;
  string local_1568;
  string local_1548;
  string local_1528;
  string local_1508;
  string local_14e8;
  string local_14c8;
  string local_14a8;
  string local_1488;
  string local_1468;
  string local_1448;
  string local_1428;
  string local_1408;
  string local_13e8;
  string local_13c8;
  string local_13a8;
  string local_1388;
  string local_1368;
  string local_1348;
  string local_1328;
  string local_1308;
  string local_12e8;
  string local_12c8;
  string local_12a8;
  string local_1288;
  string local_1268;
  string local_1248;
  string local_1228;
  string local_1208;
  string local_11e8;
  string local_11c8;
  string local_11a8;
  string local_1188;
  string local_1168;
  string local_1148;
  string local_1128;
  string local_1108;
  string local_10e8;
  string local_10c8;
  string local_10a8;
  string local_1088;
  string local_1068;
  string local_1048;
  string local_1028;
  string local_1008;
  string local_fe8;
  string local_fc8;
  string local_fa8;
  string local_f88;
  string local_f68;
  string local_f48;
  string local_f28;
  string local_f08;
  string local_ee8;
  string local_ec8;
  string local_ea8;
  string local_e88;
  string local_e68;
  string local_e48;
  string local_e28;
  string local_e08;
  string local_de8;
  string local_dc8;
  string local_da8;
  string local_d88;
  string local_d68;
  string local_d48;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  string local_ca8;
  string local_c88;
  string local_c68;
  string local_c48;
  string local_c28;
  string local_c08;
  string local_be8;
  string local_bc8;
  string local_ba8;
  string local_b88;
  string local_b68;
  string local_b48;
  string local_b28;
  string local_b08;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  string local_a68;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  string local_9a8;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string appsConfigPath;
  string fields;
  string prefix;
  string local_288;
  string local_268;
  LogFunc logFunc;
  App app;
  
  ix::initNetSystem();
  logFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  logFunc.super__Function_base._M_functor._8_8_ = 0;
  logFunc._M_invoker =
       CLI::std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tiwariashish86[P]IXWebSocket/ws/ws.cpp:31:41)>
       ::_M_invoke;
  logFunc.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tiwariashish86[P]IXWebSocket/ws/ws.cpp:31:41)>
       ::_M_manager;
  ix::IXCoreLogger::setLogFunction(&logFunc);
  std::__cxx11::string::string((string *)&local_268,"ws is a websocket tool",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_288,"",(allocator *)&url);
  CLI::App::App(&app,&local_268,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  app.require_subcommand_min_ = 1;
  app.require_subcommand_max_ = 0;
  std::__cxx11::string::string((string *)&url,"ws://127.0.0.1:8008",(allocator *)&f);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  user._M_dataplus._M_p = (pointer)&user.field_2;
  user._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  user.field_2._M_local_buf[0] = '\0';
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  headers._M_dataplus._M_p = (pointer)&headers.field_2;
  headers._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  headers.field_2._M_local_buf[0] = '\0';
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&hostname,"127.0.0.1",(allocator *)&f);
  pidfile._M_dataplus._M_p = (pointer)&pidfile.field_2;
  pidfile._M_string_length = 0;
  pidfile.field_2._M_local_buf[0] = '\0';
  channel._M_dataplus._M_p = (pointer)&channel.field_2;
  channel._M_string_length = 0;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  channel.field_2._M_local_buf[0] = '\0';
  message.field_2._M_local_buf[0] = '\0';
  password._M_dataplus._M_p = (pointer)&password.field_2;
  password._M_string_length = 0;
  appkey._M_dataplus._M_p = (pointer)&appkey.field_2;
  appkey._M_string_length = 0;
  password.field_2._M_local_buf[0] = '\0';
  appkey.field_2._M_local_buf[0] = '\0';
  endpoint._M_dataplus._M_p = (pointer)&endpoint.field_2;
  endpoint._M_string_length = 0;
  rolename._M_dataplus._M_p = (pointer)&rolename.field_2;
  rolename._M_string_length = 0;
  endpoint.field_2._M_local_buf[0] = '\0';
  rolename.field_2._M_local_buf[0] = '\0';
  rolesecret._M_dataplus._M_p = (pointer)&rolesecret.field_2;
  rolesecret._M_string_length = 0;
  rolesecret.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&prefix,"ws.test.v0",(allocator *)&f);
  fields._M_dataplus._M_p = (pointer)&fields.field_2;
  fields._M_string_length = 0;
  fields.field_2._M_local_buf[0] = '\0';
  dsn._M_dataplus._M_p = (pointer)&dsn.field_2;
  dsn._M_string_length = 0;
  dsn.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&redisHosts,"127.0.0.1",(allocator *)&f);
  redisPassword._M_dataplus._M_p = (pointer)&redisPassword.field_2;
  redisPassword._M_string_length = 0;
  redisPassword.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&appsConfigPath,"appsConfig.json",(allocator *)&f);
  headersOnly = false;
  followRedirects = false;
  verbose = false;
  save = false;
  compress = false;
  strict = false;
  stress = false;
  disableAutomaticReconnection = false;
  port = 0x1f48;
  redisPort = 0x18eb;
  statsdPort = 0x1fbd;
  connectTimeOut = 0x3c;
  delayMs = -1;
  transferTimeout = 0x708;
  maxRedirects = 5;
  count = 1;
  jobs = 4;
  std::__cxx11::string::string((string *)&local_308,"send",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_328,"Send a file",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_308,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string((string *)&local_348,"url",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_368,"Connection url",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_348,&url,&local_368);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::string((string *)&local_388,"path",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_3a8,"Path to the file to send",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_388,&path,&local_3a8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Option::check(pOVar5,(Validator *)CLI::ExistingPath);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::string((string *)&local_3c8,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_3e8,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_3c8,&pidfile,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::string((string *)&local_408,"receive",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_428,"Receive a file",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_408,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::string((string *)&local_448,"url",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_468,"Connection url",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_448,&url,&local_468);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::string((string *)&local_488,"--delay",(allocator *)&f);
  std::__cxx11::string::string
            ((string *)&local_4a8,
             "Delay (ms) to wait after receiving a fragment to artificially slow down the receiver",
             &local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_488,&delayMs,&local_4a8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::string((string *)&local_4c8,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_4e8,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_4c8,&pidfile,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::string((string *)&local_508,"transfer",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_528,"Broadcasting server",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_508,&local_528);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::string((string *)&local_548,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_568,"Connection url",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_548,&port,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string((string *)&local_588,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_5a8,"Hostname",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_588,&hostname,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::string((string *)&local_5c8,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_5e8,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_5c8,&pidfile,&local_5e8);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::string((string *)&local_608,"connect",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_628,"Connect to a remote server",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_608,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::string((string *)&local_648,"url",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_668,"Connection url",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_648,&url,&local_668);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::string((string *)&local_688,"-d",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_6a8,"Disable Automatic Reconnection",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar4,&local_688,&disableAutomaticReconnection,&local_6a8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::string((string *)&local_6c8,"chat",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_6e8,"Group chat",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_6c8,&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::string((string *)&local_708,"url",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_728,"Connection url",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_708,&url,&local_728);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::string((string *)&local_748,"user",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_768,"User name",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_748,&user,&local_768);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::string((string *)&local_788,"echo_server",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_7a8,"Echo server",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_788,&local_7a8);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::string((string *)&local_7c8,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_7e8,"Port",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_7c8,&port,&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::string((string *)&local_808,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_828,"Hostname",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_808,&hostname,&local_828);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::string((string *)&local_848,"broadcast_server",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_868,"Broadcasting server",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_848,&local_868);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::string((string *)&local_888,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_8a8,"Port",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_888,&port,&local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::string((string *)&local_8c8,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_8e8,"Hostname",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_8c8,&hostname,&local_8e8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::string((string *)&local_908,"ping",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_928,"Ping pong",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_908,&local_928);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::string((string *)&local_948,"url",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_968,"Connection url",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_948,&url,&local_968);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::string((string *)&local_988,"curl",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_9a8,"HTTP Client",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_988,&local_9a8);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::string((string *)&local_9c8,"url",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_9e8,"Connection url",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_9c8,&url,&local_9e8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::string((string *)&local_a08,"-d",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_a28,"Form data",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_a08,&data,&local_a28);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::string((string *)&local_a48,"-F",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_a68,"Form data",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_a48,&data,&local_a68);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_a68);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::string((string *)&local_a88,"-H",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_aa8,"Header",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_a88,&headers,&local_aa8);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_a88);
  std::__cxx11::string::string((string *)&local_ac8,"--output",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_ae8,"Output file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_ac8,&output,&local_ae8);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_ac8);
  std::__cxx11::string::string((string *)&local_b08,"-I",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_b28,"Send a HEAD request",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_b08,&headersOnly,&local_b28);
  std::__cxx11::string::~string((string *)&local_b28);
  std::__cxx11::string::~string((string *)&local_b08);
  std::__cxx11::string::string((string *)&local_b48,"-L",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_b68,"Follow redirects",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_b48,&followRedirects,&local_b68);
  std::__cxx11::string::~string((string *)&local_b68);
  std::__cxx11::string::~string((string *)&local_b48);
  std::__cxx11::string::string((string *)&local_b88,"--max-redirects",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_ba8,"Max Redirects",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_b88,&maxRedirects,&local_ba8);
  std::__cxx11::string::~string((string *)&local_ba8);
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::string((string *)&local_bc8,"-v",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_be8,"Verbose",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_bc8,&verbose,&local_be8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::__cxx11::string::string((string *)&local_c08,"-O",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_c28,"Save output to disk",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_c08,&save,&local_c28);
  std::__cxx11::string::~string((string *)&local_c28);
  std::__cxx11::string::~string((string *)&local_c08);
  std::__cxx11::string::string((string *)&local_c48,"--compress",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_c68,"Enable gzip compression",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_c48,&compress,&local_c68);
  std::__cxx11::string::~string((string *)&local_c68);
  std::__cxx11::string::~string((string *)&local_c48);
  std::__cxx11::string::string((string *)&local_c88,"--connect-timeout",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_ca8,"Connection timeout",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_c88,&connectTimeOut,&local_ca8);
  std::__cxx11::string::~string((string *)&local_ca8);
  std::__cxx11::string::~string((string *)&local_c88);
  std::__cxx11::string::string((string *)&local_cc8,"--transfer-timeout",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_ce8,"Transfer timeout",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_cc8,&transferTimeout,&local_ce8);
  std::__cxx11::string::~string((string *)&local_ce8);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::__cxx11::string::string((string *)&local_d08,"redis_publish",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_d28,"Redis publisher",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_d08,&local_d28);
  std::__cxx11::string::~string((string *)&local_d28);
  std::__cxx11::string::~string((string *)&local_d08);
  std::__cxx11::string::string((string *)&local_d48,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_d68,"Port",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_d48,&redisPort,&local_d68);
  std::__cxx11::string::~string((string *)&local_d68);
  std::__cxx11::string::~string((string *)&local_d48);
  std::__cxx11::string::string((string *)&local_d88,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_da8,"Hostname",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_d88,&hostname,&local_da8);
  std::__cxx11::string::~string((string *)&local_da8);
  std::__cxx11::string::~string((string *)&local_d88);
  std::__cxx11::string::string((string *)&local_dc8,"--password",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_de8,"Password",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_dc8,&password,&local_de8);
  std::__cxx11::string::~string((string *)&local_de8);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::__cxx11::string::string((string *)&local_e08,"channel",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_e28,"Channel",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_e08,&channel,&local_e28);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_e28);
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::string((string *)&local_e48,"message",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_e68,"Message",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_e48,&message,&local_e68);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string((string *)&local_e48);
  std::__cxx11::string::string((string *)&local_e88,"-c",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_ea8,"Count",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_e88,&count,&local_ea8);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::__cxx11::string::~string((string *)&local_e88);
  std::__cxx11::string::string((string *)&local_ec8,"redis_subscribe",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_ee8,"Redis subscriber",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_ec8,&local_ee8);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string((string *)&local_ec8);
  std::__cxx11::string::string((string *)&local_f08,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_f28,"Port",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_f08,&redisPort,&local_f28);
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string((string *)&local_f08);
  std::__cxx11::string::string((string *)&local_f48,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_f68,"Hostname",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_f48,&hostname,&local_f68);
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::string((string *)&local_f88,"--password",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_fa8,"Password",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_f88,&password,&local_fa8);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string((string *)&local_f88);
  std::__cxx11::string::string((string *)&local_fc8,"channel",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_fe8,"Channel",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_fc8,&channel,&local_fe8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_fe8);
  std::__cxx11::string::~string((string *)&local_fc8);
  std::__cxx11::string::string((string *)&local_1008,"-v",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1028,"Verbose",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1008,&verbose,&local_1028);
  std::__cxx11::string::~string((string *)&local_1028);
  std::__cxx11::string::~string((string *)&local_1008);
  std::__cxx11::string::string((string *)&local_1048,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1068,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1048,&pidfile,&local_1068);
  std::__cxx11::string::~string((string *)&local_1068);
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::string((string *)&local_1088,"cobra_subscribe",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_10a8,"Cobra subscriber",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_1088,&local_10a8);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::__cxx11::string::~string((string *)&local_1088);
  std::__cxx11::string::string((string *)&local_10c8,"--appkey",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_10e8,"Appkey",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_10c8,&appkey,&local_10e8);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::__cxx11::string::~string((string *)&local_10c8);
  std::__cxx11::string::string((string *)&local_1108,"--endpoint",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1128,"Endpoint",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1108,&endpoint,&local_1128);
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::~string((string *)&local_1108);
  std::__cxx11::string::string((string *)&local_1148,"--rolename",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1168,"Role name",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1148,&rolename,&local_1168);
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string((string *)&local_1148);
  std::__cxx11::string::string((string *)&local_1188,"--rolesecret",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_11a8,"Role secret",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1188,&rolesecret,&local_11a8);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string((string *)&local_1188);
  std::__cxx11::string::string((string *)&local_11c8,"channel",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_11e8,"Channel",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_11c8,&channel,&local_11e8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string((string *)&local_11c8);
  std::__cxx11::string::string((string *)&local_1208,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1228,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1208,&pidfile,&local_1228);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string((string *)&local_1208);
  std::__cxx11::string::string((string *)&local_1248,"cobra_publish",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1268,"Cobra publisher",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_1248,&local_1268);
  std::__cxx11::string::~string((string *)&local_1268);
  std::__cxx11::string::~string((string *)&local_1248);
  std::__cxx11::string::string((string *)&local_1288,"--appkey",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_12a8,"Appkey",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1288,&appkey,&local_12a8);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::__cxx11::string::~string((string *)&local_1288);
  std::__cxx11::string::string((string *)&local_12c8,"--endpoint",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_12e8,"Endpoint",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_12c8,&endpoint,&local_12e8);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::~string((string *)&local_12c8);
  std::__cxx11::string::string((string *)&local_1308,"--rolename",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1328,"Role name",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1308,&rolename,&local_1328);
  std::__cxx11::string::~string((string *)&local_1328);
  std::__cxx11::string::~string((string *)&local_1308);
  std::__cxx11::string::string((string *)&local_1348,"--rolesecret",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1368,"Role secret",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1348,&rolesecret,&local_1368);
  std::__cxx11::string::~string((string *)&local_1368);
  std::__cxx11::string::~string((string *)&local_1348);
  std::__cxx11::string::string((string *)&local_1388,"channel",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_13a8,"Channel",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1388,&channel,&local_13a8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_13a8);
  std::__cxx11::string::~string((string *)&local_1388);
  std::__cxx11::string::string((string *)&local_13c8,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_13e8,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_13c8,&pidfile,&local_13e8);
  std::__cxx11::string::~string((string *)&local_13e8);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::__cxx11::string::string((string *)&local_1408,"path",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1428,"Path to the file to send",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1408,&path,&local_1428);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  CLI::Option::check(pOVar5,(Validator *)CLI::ExistingPath);
  std::__cxx11::string::~string((string *)&local_1428);
  std::__cxx11::string::~string((string *)&local_1408);
  std::__cxx11::string::string((string *)&local_1448,"--stress",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1468,"Stress mode",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1448,&stress,&local_1468);
  std::__cxx11::string::~string((string *)&local_1468);
  std::__cxx11::string::~string((string *)&local_1448);
  std::__cxx11::string::string((string *)&local_1488,"cobra_to_statsd",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_14a8,"Cobra to statsd",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_1488,&local_14a8);
  std::__cxx11::string::~string((string *)&local_14a8);
  std::__cxx11::string::~string((string *)&local_1488);
  std::__cxx11::string::string((string *)&local_14c8,"--appkey",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_14e8,"Appkey",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_14c8,&appkey,&local_14e8);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::__cxx11::string::~string((string *)&local_14c8);
  std::__cxx11::string::string((string *)&local_1508,"--endpoint",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1528,"Endpoint",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1508,&endpoint,&local_1528);
  std::__cxx11::string::~string((string *)&local_1528);
  std::__cxx11::string::~string((string *)&local_1508);
  std::__cxx11::string::string((string *)&local_1548,"--rolename",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1568,"Role name",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1548,&rolename,&local_1568);
  std::__cxx11::string::~string((string *)&local_1568);
  std::__cxx11::string::~string((string *)&local_1548);
  std::__cxx11::string::string((string *)&local_1588,"--rolesecret",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_15a8,"Role secret",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1588,&rolesecret,&local_15a8);
  std::__cxx11::string::~string((string *)&local_15a8);
  std::__cxx11::string::~string((string *)&local_1588);
  std::__cxx11::string::string((string *)&local_15c8,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_15e8,"Statsd host",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_15c8,&hostname,&local_15e8);
  std::__cxx11::string::~string((string *)&local_15e8);
  std::__cxx11::string::~string((string *)&local_15c8);
  std::__cxx11::string::string((string *)&local_1608,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1628,"Statsd port",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1608,&statsdPort,&local_1628);
  std::__cxx11::string::~string((string *)&local_1628);
  std::__cxx11::string::~string((string *)&local_1608);
  std::__cxx11::string::string((string *)&local_1648,"--prefix",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1668,"Statsd prefix",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1648,&prefix,&local_1668);
  std::__cxx11::string::~string((string *)&local_1668);
  std::__cxx11::string::~string((string *)&local_1648);
  std::__cxx11::string::string((string *)&local_1688,"--fields",(allocator *)&f);
  std::__cxx11::string::string
            ((string *)&local_16a8,"Extract fields for naming the event",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1688,&fields,&local_16a8);
  CLI::OptionBase<CLI::Option>::join(&pOVar5->super_OptionBase<CLI::Option>);
  std::__cxx11::string::~string((string *)&local_16a8);
  std::__cxx11::string::~string((string *)&local_1688);
  std::__cxx11::string::string((string *)&local_16c8,"channel",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_16e8,"Channel",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_16c8,&channel,&local_16e8);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_16e8);
  std::__cxx11::string::~string((string *)&local_16c8);
  std::__cxx11::string::string((string *)&local_1708,"-v",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1728,"Verbose",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1708,&verbose,&local_1728);
  std::__cxx11::string::~string((string *)&local_1728);
  std::__cxx11::string::~string((string *)&local_1708);
  std::__cxx11::string::string((string *)&local_1748,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1768,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1748,&pidfile,&local_1768);
  std::__cxx11::string::~string((string *)&local_1768);
  std::__cxx11::string::~string((string *)&local_1748);
  std::__cxx11::string::string((string *)&local_1788,"cobra_to_sentry",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_17a8,"Cobra to sentry",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_1788,&local_17a8);
  std::__cxx11::string::~string((string *)&local_17a8);
  std::__cxx11::string::~string((string *)&local_1788);
  std::__cxx11::string::string((string *)&local_17c8,"--appkey",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_17e8,"Appkey",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_17c8,&appkey,&local_17e8);
  std::__cxx11::string::~string((string *)&local_17e8);
  std::__cxx11::string::~string((string *)&local_17c8);
  std::__cxx11::string::string((string *)&local_1808,"--endpoint",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1828,"Endpoint",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1808,&endpoint,&local_1828);
  std::__cxx11::string::~string((string *)&local_1828);
  std::__cxx11::string::~string((string *)&local_1808);
  std::__cxx11::string::string((string *)&local_1848,"--rolename",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1868,"Role name",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1848,&rolename,&local_1868);
  std::__cxx11::string::~string((string *)&local_1868);
  std::__cxx11::string::~string((string *)&local_1848);
  std::__cxx11::string::string((string *)&local_1888,"--rolesecret",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_18a8,"Role secret",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1888,&rolesecret,&local_18a8);
  std::__cxx11::string::~string((string *)&local_18a8);
  std::__cxx11::string::~string((string *)&local_1888);
  std::__cxx11::string::string((string *)&local_18c8,"--dsn",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_18e8,"Sentry DSN",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_18c8,&dsn,&local_18e8);
  std::__cxx11::string::~string((string *)&local_18e8);
  std::__cxx11::string::~string((string *)&local_18c8);
  std::__cxx11::string::string((string *)&local_1908,"--jobs",(allocator *)&f);
  std::__cxx11::string::string
            ((string *)&local_1928,"Number of thread sending events to Sentry",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1908,&jobs,&local_1928);
  std::__cxx11::string::~string((string *)&local_1928);
  std::__cxx11::string::~string((string *)&local_1908);
  std::__cxx11::string::string((string *)&local_1948,"channel",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1968,"Channel",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1948,&channel,&local_1968);
  (pOVar5->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_1968);
  std::__cxx11::string::~string((string *)&local_1948);
  std::__cxx11::string::string((string *)&local_1988,"-v",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_19a8,"Verbose",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1988,&verbose,&local_19a8);
  std::__cxx11::string::~string((string *)&local_19a8);
  std::__cxx11::string::~string((string *)&local_1988);
  std::__cxx11::string::string((string *)&local_19c8,"-s",(allocator *)&f);
  std::__cxx11::string::string
            ((string *)&local_19e8,"Strict mode. Error out when sending to sentry fails",&local_22d5
            );
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_19c8,&strict,&local_19e8);
  std::__cxx11::string::~string((string *)&local_19e8);
  std::__cxx11::string::~string((string *)&local_19c8);
  std::__cxx11::string::string((string *)&local_1a08,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1a28,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1a08,&pidfile,&local_1a28);
  std::__cxx11::string::~string((string *)&local_1a28);
  std::__cxx11::string::~string((string *)&local_1a08);
  std::__cxx11::string::string((string *)&local_1a48,"snake",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1a68,"Snake server",&local_22d5);
  pAVar4 = CLI::App::add_subcommand(&app,&local_1a48,&local_1a68);
  std::__cxx11::string::~string((string *)&local_1a68);
  std::__cxx11::string::~string((string *)&local_1a48);
  std::__cxx11::string::string((string *)&local_1a88,"--port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1aa8,"Connection url",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1a88,&port,&local_1aa8);
  std::__cxx11::string::~string((string *)&local_1aa8);
  std::__cxx11::string::~string((string *)&local_1a88);
  std::__cxx11::string::string((string *)&local_1ac8,"--host",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1ae8,"Hostname",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1ac8,&hostname,&local_1ae8);
  std::__cxx11::string::~string((string *)&local_1ae8);
  std::__cxx11::string::~string((string *)&local_1ac8);
  std::__cxx11::string::string((string *)&local_1b08,"--pidfile",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1b28,"Pid file",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1b08,&pidfile,&local_1b28);
  std::__cxx11::string::~string((string *)&local_1b28);
  std::__cxx11::string::~string((string *)&local_1b08);
  std::__cxx11::string::string((string *)&local_1b48,"--redis_hosts",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1b68,"Redis hosts",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1b48,&redisHosts,&local_1b68);
  std::__cxx11::string::~string((string *)&local_1b68);
  std::__cxx11::string::~string((string *)&local_1b48);
  std::__cxx11::string::string((string *)&local_1b88,"--redis_port",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1ba8,"Redis hosts",&local_22d5);
  CLI::App::add_option<int,_(CLI::detail::enabler)0>(pAVar4,&local_1b88,&redisPort,&local_1ba8);
  std::__cxx11::string::~string((string *)&local_1ba8);
  std::__cxx11::string::~string((string *)&local_1b88);
  std::__cxx11::string::string((string *)&local_1bc8,"--redis_password",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1be8,"Redis password",&local_22d5);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar4,&local_1bc8,&redisPassword,&local_1be8);
  std::__cxx11::string::~string((string *)&local_1be8);
  std::__cxx11::string::~string((string *)&local_1bc8);
  std::__cxx11::string::string((string *)&local_1c08,"--apps_config_path",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1c28,"Path to auth data",&local_22d5);
  pOVar5 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar4,&local_1c08,&appsConfigPath,&local_1c28);
  CLI::Option::check(pOVar5,(Validator *)CLI::ExistingPath);
  std::__cxx11::string::~string((string *)&local_1c28);
  std::__cxx11::string::~string((string *)&local_1c08);
  std::__cxx11::string::string((string *)&local_1c48,"-v",(allocator *)&f);
  std::__cxx11::string::string((string *)&local_1c68,"Verbose",&local_22d5);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(pAVar4,&local_1c48,&verbose,&local_1c68);
  std::__cxx11::string::~string((string *)&local_1c68);
  std::__cxx11::string::~string((string *)&local_1c48);
  CLI::App::parse(&app,argc,argv);
  if (pidfile._M_string_length != 0) {
    unlink(pidfile._M_dataplus._M_p);
    std::ofstream::ofstream(&f);
    std::ofstream::open((string *)&f,(_Ios_Openmode)&pidfile);
    _Var2 = getpid();
    std::ostream::operator<<(&f,_Var2);
    std::ofstream::close();
    std::ofstream::~ofstream(&f);
  }
  std::__cxx11::string::string((string *)&local_1c88,"transfer",(allocator *)&f);
  bVar1 = CLI::App::got_subcommand(&app,&local_1c88);
  std::__cxx11::string::~string((string *)&local_1c88);
  if (bVar1) {
    iVar3 = ix::ws_transfer_main(port,(string *)&hostname);
  }
  else {
    std::__cxx11::string::string((string *)&local_1ca8,"send",(allocator *)&f);
    bVar1 = CLI::App::got_subcommand(&app,&local_1ca8);
    std::__cxx11::string::~string((string *)&local_1ca8);
    if (bVar1) {
      iVar3 = ix::ws_send_main((string *)&url,(string *)&path);
    }
    else {
      std::__cxx11::string::string((string *)&local_1cc8,"receive",(allocator *)&f);
      bVar1 = CLI::App::got_subcommand(&app,&local_1cc8);
      std::__cxx11::string::~string((string *)&local_1cc8);
      if (bVar1) {
        iVar3 = ix::ws_receive_main((string *)&url,false,delayMs);
      }
      else {
        std::__cxx11::string::string((string *)&local_1ce8,"connect",(allocator *)&f);
        bVar1 = CLI::App::got_subcommand(&app,&local_1ce8);
        std::__cxx11::string::~string((string *)&local_1ce8);
        if (bVar1) {
          iVar3 = ix::ws_connect_main((string *)&url,disableAutomaticReconnection);
        }
        else {
          std::__cxx11::string::string((string *)&local_1d08,"chat",(allocator *)&f);
          bVar1 = CLI::App::got_subcommand(&app,&local_1d08);
          std::__cxx11::string::~string((string *)&local_1d08);
          if (bVar1) {
            iVar3 = ix::ws_chat_main((string *)&url,(string *)&user);
          }
          else {
            std::__cxx11::string::string((string *)&local_1d28,"echo_server",(allocator *)&f);
            bVar1 = CLI::App::got_subcommand(&app,&local_1d28);
            std::__cxx11::string::~string((string *)&local_1d28);
            if (bVar1) {
              iVar3 = ix::ws_echo_server_main(port,(string *)&hostname);
            }
            else {
              std::__cxx11::string::string((string *)&local_1d48,"broadcast_server",(allocator *)&f)
              ;
              bVar1 = CLI::App::got_subcommand(&app,&local_1d48);
              std::__cxx11::string::~string((string *)&local_1d48);
              if (bVar1) {
                iVar3 = ix::ws_broadcast_server_main(port,(string *)&hostname);
              }
              else {
                std::__cxx11::string::string((string *)&local_1d68,"ping",(allocator *)&f);
                bVar1 = CLI::App::got_subcommand(&app,&local_1d68);
                std::__cxx11::string::~string((string *)&local_1d68);
                if (bVar1) {
                  iVar3 = ix::ws_ping_pong_main((string *)&url);
                }
                else {
                  std::__cxx11::string::string((string *)&local_1d88,"curl",(allocator *)&f);
                  bVar1 = CLI::App::got_subcommand(&app,&local_1d88);
                  std::__cxx11::string::~string((string *)&local_1d88);
                  if (bVar1) {
                    iVar3 = ix::ws_http_client_main
                                      ((string *)&url,(string *)&headers,(string *)&data,headersOnly
                                       ,connectTimeOut,transferTimeout,followRedirects,maxRedirects,
                                       verbose,save,(string *)&output,compress);
                  }
                  else {
                    std::__cxx11::string::string
                              ((string *)&local_1da8,"redis_publish",(allocator *)&f);
                    bVar1 = CLI::App::got_subcommand(&app,&local_1da8);
                    std::__cxx11::string::~string((string *)&local_1da8);
                    if (bVar1) {
                      iVar3 = ix::ws_redis_publish_main
                                        ((string *)&hostname,redisPort,(string *)&password,
                                         (string *)&channel,(string *)&message,count);
                    }
                    else {
                      std::__cxx11::string::string
                                ((string *)&local_1dc8,"redis_subscribe",(allocator *)&f);
                      bVar1 = CLI::App::got_subcommand(&app,&local_1dc8);
                      std::__cxx11::string::~string((string *)&local_1dc8);
                      if (bVar1) {
                        iVar3 = ix::ws_redis_subscribe_main
                                          ((string *)&hostname,redisPort,(string *)&password,
                                           (string *)&channel,verbose);
                      }
                      else {
                        std::__cxx11::string::string
                                  ((string *)&local_1de8,"cobra_subscribe",(allocator *)&f);
                        bVar1 = CLI::App::got_subcommand(&app,&local_1de8);
                        std::__cxx11::string::~string((string *)&local_1de8);
                        if (bVar1) {
                          iVar3 = ix::ws_cobra_subscribe_main
                                            ((string *)&appkey,(string *)&endpoint,
                                             (string *)&rolename,(string *)&rolesecret,
                                             (string *)&channel);
                        }
                        else {
                          std::__cxx11::string::string
                                    ((string *)&local_1e08,"cobra_publish",(allocator *)&f);
                          bVar1 = CLI::App::got_subcommand(&app,&local_1e08);
                          std::__cxx11::string::~string((string *)&local_1e08);
                          if (bVar1) {
                            iVar3 = ix::ws_cobra_publish_main
                                              ((string *)&appkey,(string *)&endpoint,
                                               (string *)&rolename,(string *)&rolesecret,
                                               (string *)&channel,(string *)&path,stress);
                          }
                          else {
                            std::__cxx11::string::string
                                      ((string *)&local_1e28,"cobra_to_statsd",(allocator *)&f);
                            bVar1 = CLI::App::got_subcommand(&app,&local_1e28);
                            std::__cxx11::string::~string((string *)&local_1e28);
                            if (bVar1) {
                              iVar3 = ix::ws_cobra_to_statsd_main
                                                ((string *)&appkey,(string *)&endpoint,
                                                 (string *)&rolename,(string *)&rolesecret,
                                                 (string *)&channel,(string *)&hostname,statsdPort,
                                                 (string *)&prefix,(string *)&fields,verbose);
                            }
                            else {
                              std::__cxx11::string::string
                                        ((string *)&local_1e48,"cobra_to_sentry",(allocator *)&f);
                              bVar1 = CLI::App::got_subcommand(&app,&local_1e48);
                              std::__cxx11::string::~string((string *)&local_1e48);
                              if (bVar1) {
                                iVar3 = ix::ws_cobra_to_sentry_main
                                                  ((string *)&appkey,(string *)&endpoint,
                                                   (string *)&rolename,(string *)&rolesecret,
                                                   (string *)&channel,(string *)&dsn,verbose,strict,
                                                   jobs);
                              }
                              else {
                                std::__cxx11::string::string
                                          ((string *)&local_1e68,"snake",(allocator *)&f);
                                bVar1 = CLI::App::got_subcommand(&app,&local_1e68);
                                std::__cxx11::string::~string((string *)&local_1e68);
                                if (bVar1) {
                                  iVar3 = ix::ws_snake_main(port,(string *)&hostname,
                                                            (string *)&redisHosts,redisPort,
                                                            (string *)&redisPassword,verbose,
                                                            (string *)&appsConfigPath);
                                }
                                else {
                                  iVar3 = 1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ix::uninitNetSystem();
  std::__cxx11::string::~string((string *)&appsConfigPath);
  std::__cxx11::string::~string((string *)&redisPassword);
  std::__cxx11::string::~string((string *)&redisHosts);
  std::__cxx11::string::~string((string *)&dsn);
  std::__cxx11::string::~string((string *)&fields);
  std::__cxx11::string::~string((string *)&prefix);
  std::__cxx11::string::~string((string *)&rolesecret);
  std::__cxx11::string::~string((string *)&rolename);
  std::__cxx11::string::~string((string *)&endpoint);
  std::__cxx11::string::~string((string *)&appkey);
  std::__cxx11::string::~string((string *)&password);
  std::__cxx11::string::~string((string *)&message);
  std::__cxx11::string::~string((string *)&channel);
  std::__cxx11::string::~string((string *)&pidfile);
  std::__cxx11::string::~string((string *)&hostname);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&headers);
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::string::~string((string *)&user);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::~string((string *)&url);
  CLI::App::~App(&app);
  std::_Function_base::~_Function_base(&logFunc.super__Function_base);
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    ix::initNetSystem();

    ix::IXCoreLogger::LogFunc logFunc = [](const char* msg)
    {
        std::cout << msg << std::endl;
    };
    ix::IXCoreLogger::setLogFunction(logFunc);

    CLI::App app{"ws is a websocket tool"};
    app.require_subcommand();

    std::string url("ws://127.0.0.1:8008");
    std::string path;
    std::string user;
    std::string data;
    std::string headers;
    std::string output;
    std::string hostname("127.0.0.1");
    std::string pidfile;
    std::string channel;
    std::string message;
    std::string password;
    std::string appkey;
    std::string endpoint;
    std::string rolename;
    std::string rolesecret;
    std::string prefix("ws.test.v0");
    std::string fields;
    std::string dsn;
    std::string redisHosts("127.0.0.1");
    std::string redisPassword;
    std::string appsConfigPath("appsConfig.json");
    bool headersOnly = false;
    bool followRedirects = false;
    bool verbose = false;
    bool save = false;
    bool compress = false;
    bool strict = false;
    bool stress = false;
    bool disableAutomaticReconnection = false;
    int port = 8008;
    int redisPort = 6379;
    int statsdPort = 8125;
    int connectTimeOut = 60;
    int transferTimeout = 1800;
    int maxRedirects = 5;
    int delayMs = -1;
    int count = 1;
    int jobs = 4;

    CLI::App* sendApp = app.add_subcommand("send", "Send a file");
    sendApp->add_option("url", url, "Connection url")->required();
    sendApp->add_option("path", path, "Path to the file to send")
        ->required()->check(CLI::ExistingPath);
    sendApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* receiveApp = app.add_subcommand("receive", "Receive a file");
    receiveApp->add_option("url", url, "Connection url")->required();
    receiveApp->add_option("--delay", delayMs, "Delay (ms) to wait after receiving a fragment"
                                               " to artificially slow down the receiver");
    receiveApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* transferApp = app.add_subcommand("transfer", "Broadcasting server");
    transferApp->add_option("--port", port, "Connection url");
    transferApp->add_option("--host", hostname, "Hostname");
    transferApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* connectApp = app.add_subcommand("connect", "Connect to a remote server");
    connectApp->add_option("url", url, "Connection url")->required();
    connectApp->add_flag("-d", disableAutomaticReconnection, "Disable Automatic Reconnection");

    CLI::App* chatApp = app.add_subcommand("chat", "Group chat");
    chatApp->add_option("url", url, "Connection url")->required();
    chatApp->add_option("user", user, "User name")->required();

    CLI::App* echoServerApp = app.add_subcommand("echo_server", "Echo server");
    echoServerApp->add_option("--port", port, "Port");
    echoServerApp->add_option("--host", hostname, "Hostname");

    CLI::App* broadcastServerApp = app.add_subcommand("broadcast_server", "Broadcasting server");
    broadcastServerApp->add_option("--port", port, "Port");
    broadcastServerApp->add_option("--host", hostname, "Hostname");

    CLI::App* pingPongApp = app.add_subcommand("ping", "Ping pong");
    pingPongApp->add_option("url", url, "Connection url")->required();

    CLI::App* httpClientApp = app.add_subcommand("curl", "HTTP Client");
    httpClientApp->add_option("url", url, "Connection url")->required();
    httpClientApp->add_option("-d", data, "Form data")->join();
    httpClientApp->add_option("-F", data, "Form data")->join();
    httpClientApp->add_option("-H", headers, "Header")->join();
    httpClientApp->add_option("--output", output, "Output file");
    httpClientApp->add_flag("-I", headersOnly, "Send a HEAD request");
    httpClientApp->add_flag("-L", followRedirects, "Follow redirects");
    httpClientApp->add_option("--max-redirects", maxRedirects, "Max Redirects");
    httpClientApp->add_flag("-v", verbose, "Verbose");
    httpClientApp->add_flag("-O", save, "Save output to disk");
    httpClientApp->add_flag("--compress", compress, "Enable gzip compression");
    httpClientApp->add_option("--connect-timeout", connectTimeOut, "Connection timeout");
    httpClientApp->add_option("--transfer-timeout", transferTimeout, "Transfer timeout");

    CLI::App* redisPublishApp = app.add_subcommand("redis_publish", "Redis publisher");
    redisPublishApp->add_option("--port", redisPort, "Port");
    redisPublishApp->add_option("--host", hostname, "Hostname");
    redisPublishApp->add_option("--password", password, "Password");
    redisPublishApp->add_option("channel", channel, "Channel")->required();
    redisPublishApp->add_option("message", message, "Message")->required();
    redisPublishApp->add_option("-c", count, "Count");

    CLI::App* redisSubscribeApp = app.add_subcommand("redis_subscribe", "Redis subscriber");
    redisSubscribeApp->add_option("--port", redisPort, "Port");
    redisSubscribeApp->add_option("--host", hostname, "Hostname");
    redisSubscribeApp->add_option("--password", password, "Password");
    redisSubscribeApp->add_option("channel", channel, "Channel")->required();
    redisSubscribeApp->add_flag("-v", verbose, "Verbose");
    redisSubscribeApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* cobraSubscribeApp = app.add_subcommand("cobra_subscribe", "Cobra subscriber");
    cobraSubscribeApp->add_option("--appkey", appkey, "Appkey");
    cobraSubscribeApp->add_option("--endpoint", endpoint, "Endpoint");
    cobraSubscribeApp->add_option("--rolename", rolename, "Role name");
    cobraSubscribeApp->add_option("--rolesecret", rolesecret, "Role secret");
    cobraSubscribeApp->add_option("channel", channel, "Channel")->required();
    cobraSubscribeApp->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* cobraPublish = app.add_subcommand("cobra_publish", "Cobra publisher");
    cobraPublish->add_option("--appkey", appkey, "Appkey");
    cobraPublish->add_option("--endpoint", endpoint, "Endpoint");
    cobraPublish->add_option("--rolename", rolename, "Role name");
    cobraPublish->add_option("--rolesecret", rolesecret, "Role secret");
    cobraPublish->add_option("channel", channel, "Channel")->required();
    cobraPublish->add_option("--pidfile", pidfile, "Pid file");
    cobraPublish->add_option("path", path, "Path to the file to send")
        ->required()->check(CLI::ExistingPath);
    cobraPublish->add_flag("--stress", stress, "Stress mode");

    CLI::App* cobra2statsd = app.add_subcommand("cobra_to_statsd", "Cobra to statsd");
    cobra2statsd->add_option("--appkey", appkey, "Appkey");
    cobra2statsd->add_option("--endpoint", endpoint, "Endpoint");
    cobra2statsd->add_option("--rolename", rolename, "Role name");
    cobra2statsd->add_option("--rolesecret", rolesecret, "Role secret");
    cobra2statsd->add_option("--host", hostname, "Statsd host");
    cobra2statsd->add_option("--port", statsdPort, "Statsd port");
    cobra2statsd->add_option("--prefix", prefix, "Statsd prefix");
    cobra2statsd->add_option("--fields", fields, "Extract fields for naming the event")->join();
    cobra2statsd->add_option("channel", channel, "Channel")->required();
    cobra2statsd->add_flag("-v", verbose, "Verbose");
    cobra2statsd->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* cobra2sentry = app.add_subcommand("cobra_to_sentry", "Cobra to sentry");
    cobra2sentry->add_option("--appkey", appkey, "Appkey");
    cobra2sentry->add_option("--endpoint", endpoint, "Endpoint");
    cobra2sentry->add_option("--rolename", rolename, "Role name");
    cobra2sentry->add_option("--rolesecret", rolesecret, "Role secret");
    cobra2sentry->add_option("--dsn", dsn, "Sentry DSN");
    cobra2sentry->add_option("--jobs", jobs, "Number of thread sending events to Sentry");
    cobra2sentry->add_option("channel", channel, "Channel")->required();
    cobra2sentry->add_flag("-v", verbose, "Verbose");
    cobra2sentry->add_flag("-s", strict, "Strict mode. Error out when sending to sentry fails");
    cobra2sentry->add_option("--pidfile", pidfile, "Pid file");

    CLI::App* runApp = app.add_subcommand("snake", "Snake server");
    runApp->add_option("--port", port, "Connection url");
    runApp->add_option("--host", hostname, "Hostname");
    runApp->add_option("--pidfile", pidfile, "Pid file");
    runApp->add_option("--redis_hosts", redisHosts, "Redis hosts");
    runApp->add_option("--redis_port", redisPort, "Redis hosts");
    runApp->add_option("--redis_password", redisPassword, "Redis password");
    runApp->add_option("--apps_config_path", appsConfigPath, "Path to auth data")
        ->check(CLI::ExistingPath);
    runApp->add_flag("-v", verbose, "Verbose");

    CLI11_PARSE(app, argc, argv);

    // pid file handling
    if (!pidfile.empty())
    {
        unlink(pidfile.c_str());

        std::ofstream f;
        f.open(pidfile);
        f << getpid();
        f.close();
    }

    int ret = 1;
    if (app.got_subcommand("transfer"))
    {
        ret = ix::ws_transfer_main(port, hostname);
    }
    else if (app.got_subcommand("send"))
    {
        ret = ix::ws_send_main(url, path);
    }
    else if (app.got_subcommand("receive"))
    {
        bool enablePerMessageDeflate = false;
        ret = ix::ws_receive_main(url, enablePerMessageDeflate, delayMs);
    }
    else if (app.got_subcommand("connect"))
    {
        ret = ix::ws_connect_main(url, disableAutomaticReconnection);
    }
    else if (app.got_subcommand("chat"))
    {
        ret = ix::ws_chat_main(url, user);
    }
    else if (app.got_subcommand("echo_server"))
    {
        ret = ix::ws_echo_server_main(port, hostname);
    }
    else if (app.got_subcommand("broadcast_server"))
    {
        ret = ix::ws_broadcast_server_main(port, hostname);
    }
    else if (app.got_subcommand("ping"))
    {
        ret = ix::ws_ping_pong_main(url);
    }
    else if (app.got_subcommand("curl"))
    {
        ret = ix::ws_http_client_main(url, headers, data, headersOnly,
                                      connectTimeOut, transferTimeout,
                                      followRedirects, maxRedirects, verbose,
                                      save, output, compress);
    }
    else if (app.got_subcommand("redis_publish"))
    {
        ret = ix::ws_redis_publish_main(hostname, redisPort, password,
                                        channel, message, count);
    }
    else if (app.got_subcommand("redis_subscribe"))
    {
        ret = ix::ws_redis_subscribe_main(hostname, redisPort, password, channel, verbose);
    }
    else if (app.got_subcommand("cobra_subscribe"))
    {
        ret = ix::ws_cobra_subscribe_main(appkey, endpoint,
                                          rolename, rolesecret,
                                          channel);
    }
    else if (app.got_subcommand("cobra_publish"))
    {
        ret = ix::ws_cobra_publish_main(appkey, endpoint,
                                        rolename, rolesecret,
                                        channel, path, stress);
    }
    else if (app.got_subcommand("cobra_to_statsd"))
    {
        ret = ix::ws_cobra_to_statsd_main(appkey, endpoint,
                                          rolename, rolesecret,
                                          channel, hostname, statsdPort,
                                          prefix, fields, verbose);
    }
    else if (app.got_subcommand("cobra_to_sentry"))
    {
        ret = ix::ws_cobra_to_sentry_main(appkey, endpoint,
                                          rolename, rolesecret,
                                          channel, dsn,
                                          verbose, strict, jobs);
    }
    else if (app.got_subcommand("snake"))
    {
        ret = ix::ws_snake_main(port, hostname,
                                redisHosts, redisPort,
                                redisPassword, verbose,
                                appsConfigPath);
    }

    ix::uninitNetSystem();
    return ret;
}